

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O3

void Bus_SclCheckSortedFanout(Vec_Ptr_t *vFanouts)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pObj;
  Abc_Obj_t *local_30;
  Abc_Obj_t *local_28;
  
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if ((long)vFanouts->nSize + -1 <= (long)uVar3) {
      return;
    }
    local_28 = (Abc_Obj_t *)vFanouts->pArray[uVar3];
    local_30 = (Abc_Obj_t *)vFanouts->pArray[uVar3 + 1];
    iVar2 = Bus_SclCompareFanouts(&local_28,&local_30);
    uVar1 = uVar3 + 1;
  } while (iVar2 == -1);
  printf("Fanouts %d and %d are out of order.\n",uVar3 & 0xffffffff,uVar3 + 1 & 0xffffffff);
  Abc_NtkPrintFanoutProfileVec((Abc_Obj_t *)0x0,vFanouts);
  return;
}

Assistant:

void Bus_SclCheckSortedFanout( Vec_Ptr_t * vFanouts )
{
    Abc_Obj_t * pObj, * pNext;
    int i;
    for ( i = 0; i < Vec_PtrSize(vFanouts) - 1; i++ )
    {
        pObj  = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, i);
        pNext = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, i+1);
        if ( Bus_SclCompareFanouts( &pObj, &pNext ) != -1 )
        {
            printf( "Fanouts %d and %d are out of order.\n", i, i+1 );
            Abc_NtkPrintFanoutProfileVec( NULL, vFanouts );
            return;
        }
    }
}